

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deThreadUnix.c
# Opt level: O2

void deThread_destroy(deThread threadptr)

{
  if (*(pthread_t *)threadptr != 0) {
    pthread_detach(*(pthread_t *)threadptr);
  }
  deFree((void *)threadptr);
  return;
}

Assistant:

void deThread_destroy (deThread threadptr)
{
	Thread* thread = (Thread*)threadptr;

	if (thread->thread)
	{
		/* Not joined, detach. */
		int ret = pthread_detach(thread->thread);
		DE_ASSERT(ret == 0);
		DE_UNREF(ret);
	}

	deFree(thread);
}